

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

int ll_loadfunc(lua_State *L,char *path,char *name,int r)

{
  int iVar1;
  size_t sVar2;
  long *plVar3;
  long lVar4;
  char *pcVar5;
  lua_CFunction f;
  
  sVar2 = strlen(path);
  if (sVar2 < 0x1000) {
    lua_pushfstring(L,"LOADLIB: %s",path);
    lua_gettable(L,-10000);
    iVar1 = lua_type(L,-1);
    if (iVar1 == 0) {
      lua_settop(L,-2);
      plVar3 = (long *)lua_newuserdata(L,8);
      *plVar3 = 0;
      luaL_setmetatable(L,"_LOADLIB");
      lua_pushfstring(L,"LOADLIB: %s",path);
      lua_pushvalue(L,-2);
      lua_settable(L,-10000);
    }
    else {
      plVar3 = (long *)lua_touserdata(L,-1);
    }
    lVar4 = *plVar3;
    if (lVar4 == 0) {
      lVar4 = dlopen(path,(uint)(*name == '*') << 8 | 2);
      if (lVar4 == 0) {
        pcVar5 = (char *)dlerror();
        lua_pushstring(L,pcVar5);
        *plVar3 = 0;
        goto LAB_00151250;
      }
      *plVar3 = lVar4;
    }
    if (*name == '*') {
      lua_pushboolean(L,1);
      iVar1 = 0;
    }
    else {
      pcVar5 = name;
      if (r == 0) {
        pcVar5 = mksymname(L,name,"luaopen_%s");
        lVar4 = *plVar3;
      }
      f = (lua_CFunction)dlsym(lVar4,pcVar5);
      if (f == (lua_CFunction)0x0) {
        pcVar5 = (char *)dlerror();
        lua_pushstring(L,pcVar5);
        iVar1 = 2;
        if (r == 0) {
          lVar4 = *plVar3;
          pcVar5 = mksymname(L,name,"luaJIT_BC_%s");
          pcVar5 = (char *)dlsym(lVar4,pcVar5);
          lua_settop(L,-2);
          if (pcVar5 != (char *)0x0) {
            iVar1 = luaL_loadbuffer(L,pcVar5,0xffffffffffffffff,name);
            iVar1 = (uint)(iVar1 != 0) * 3;
          }
        }
      }
      else {
        iVar1 = 0;
        lua_pushcclosure(L,f,0);
      }
    }
  }
  else {
    lua_pushlstring(L,"path too long",0xd);
LAB_00151250:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int ll_loadfunc(lua_State *L, const char *path, const char *name, int r)
{
  void **reg;
  if (strlen(path) >= 4096) {
    lua_pushliteral(L, "path too long");
    return PACKAGE_ERR_LIB;
  }
  reg = ll_register(L, path);
  if (*reg == NULL) *reg = ll_load(L, path, (*name == '*'));
  if (*reg == NULL) {
    return PACKAGE_ERR_LIB;  /* Unable to load library. */
  } else if (*name == '*') {  /* Only load library into global namespace. */
    lua_pushboolean(L, 1);
    return 0;
  } else {
    const char *sym = r ? name : mksymname(L, name, SYMPREFIX_CF);
    lua_CFunction f = ll_sym(L, *reg, sym);
    if (f) {
      lua_pushcfunction(L, f);
      return 0;
    }
    if (!r) {
      const char *bcdata = ll_bcsym(*reg, mksymname(L, name, SYMPREFIX_BC));
      lua_pop(L, 1);
      if (bcdata) {
	if (luaL_loadbuffer(L, bcdata, ~(size_t)0, name) != 0)
	  return PACKAGE_ERR_LOAD;
	return 0;
      }
    }
    return PACKAGE_ERR_FUNC;  /* Unable to find function. */
  }
}